

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

void __thiscall DCorpsePointer::Destroy(DCorpsePointer *this)

{
  DWORD DVar1;
  DCorpsePointer *pDVar2;
  AActor *pAVar3;
  TThinkerIterator<DCorpsePointer> iterator;
  
  TThinkerIterator<DCorpsePointer>::TThinkerIterator
            ((TThinkerIterator<DCorpsePointer> *)&iterator.super_FThinkerIterator,3);
  pDVar2 = (DCorpsePointer *)FThinkerIterator::Next(&iterator.super_FThinkerIterator);
  DVar1 = pDVar2->Count;
  if (pDVar2 == this) {
    pDVar2 = (DCorpsePointer *)FThinkerIterator::Next(&iterator.super_FThinkerIterator);
    if (pDVar2 == (DCorpsePointer *)0x0) goto LAB_00555c43;
  }
  pDVar2->Count = DVar1 - 1;
LAB_00555c43:
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->Corpse);
  if (pAVar3 != (AActor *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->Corpse);
    (*(pAVar3->super_DThinker).super_DObject._vptr_DObject[4])(pAVar3);
  }
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DCorpsePointer::Destroy ()
{
	// Store the count of corpses in the first thinker in the list
	TThinkerIterator<DCorpsePointer> iterator (STAT_CORPSEPOINTER);
	DCorpsePointer *first = iterator.Next ();

	int prevCount = first->Count;

	if (first == this)
	{
		first = iterator.Next ();
	}

	if (first != NULL)
	{
		first->Count = prevCount - 1;
	}

	if (Corpse != NULL)
	{
		Corpse->Destroy ();
	}
	Super::Destroy ();
}